

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O0

QAction * __thiscall QToolBar::insertWidget(QToolBar *this,QAction *before,QWidget *widget)

{
  QAction *this_00;
  QWidgetActionPrivate *pQVar1;
  QWidget *in_RDX;
  QObject *in_RDI;
  QWidgetAction *action;
  QAction *in_stack_00000038;
  QWidgetAction *in_stack_ffffffffffffffe0;
  
  this_00 = (QAction *)operator_new(0x10);
  QWidgetAction::QWidgetAction(in_stack_ffffffffffffffe0,in_RDI);
  QWidgetAction::setDefaultWidget((QWidgetAction *)this_00,in_RDX);
  pQVar1 = QWidgetAction::d_func((QWidgetAction *)0x6ecd00);
  pQVar1->field_0x1d0 = pQVar1->field_0x1d0 & 0xfd | 2;
  QWidget::insertAction(in_RDX,in_stack_00000038,(QAction *)this);
  return this_00;
}

Assistant:

QAction *QToolBar::insertWidget(QAction *before, QWidget *widget)
{
    QWidgetAction *action = new QWidgetAction(this);
    action->setDefaultWidget(widget);
    action->d_func()->autoCreated = true;
    insertAction(before, action);
    return action;
}